

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O3

PROCESSOR_TYPE __thiscall ezc3d::Header::readProcessorType(Header *this,c3d *c3d,fstream *file)

{
  size_t sVar1;
  runtime_error *this_00;
  undefined1 auVar2 [16];
  
  auVar2 = std::istream::tellg();
  sVar1 = ezc3d::c3d::readUint(c3d,INTEL,file,1,0,(seekdir *)&std::ios_base::beg);
  sVar1 = ezc3d::c3d::readUint
                    (c3d,INTEL,file,1,(int)sVar1 * 0x200 + -0x1fd,(seekdir *)&std::ios_base::beg);
  std::istream::seekg(file,auVar2._0_8_,auVar2._8_8_);
  if (sVar1 - 0x54 < 3) {
    return (PROCESSOR_TYPE)(sVar1 - 0x54) | INTEL;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not read the processor type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ezc3d::PROCESSOR_TYPE ezc3d::Header::readProcessorType(c3d &c3d,
                                                       std::fstream &file) {
  // Remember the current position of the cursor
  std::streampos dataPos = file.tellg();

  // Read the processor type (assuming Intel type)
  size_t parametersAddress(c3d.readUint(PROCESSOR_TYPE::INTEL, file,
                                        1 * ezc3d::DATA_TYPE::BYTE, 0,
                                        std::ios::beg));
  size_t processorType = c3d.readUint(
      PROCESSOR_TYPE::INTEL, file, 1 * ezc3d::DATA_TYPE::BYTE,
      static_cast<int>(256 * ezc3d::DATA_TYPE::WORD * (parametersAddress - 1)) +
          3 * ezc3d::DATA_TYPE::BYTE,
      std::ios::beg);

  // Put back the cursor in the file
  file.seekg(dataPos);

  if (processorType == 84)
    return ezc3d::PROCESSOR_TYPE::INTEL;
  else if (processorType == 85)
    return ezc3d::PROCESSOR_TYPE::DEC;
  else if (processorType == 86)
    return ezc3d::PROCESSOR_TYPE::MIPS;
  else
    throw std::runtime_error("Could not read the processor type");
}